

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_format.hpp
# Opt level: O0

string_t * cfgfile::from_cfgfile_format<cfgfile::qstring_trait_t>(string_t *what)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined8 uVar4;
  string_t *what_00;
  string_t *in_RDI;
  size_type i;
  string_t tmp;
  string_t *result;
  qstring_wrapper_t *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe10;
  QChar in_stack_fffffffffffffe16;
  string_t *in_stack_fffffffffffffe18;
  exception_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffe20;
  exception_t<cfgfile::qstring_trait_t> *this;
  allocator<char> *in_stack_fffffffffffffe40;
  allocator<char> *__a;
  undefined2 in_stack_fffffffffffffe48;
  QChar in_stack_fffffffffffffe4a;
  QChar in_stack_fffffffffffffe4c;
  QChar in_stack_fffffffffffffe4e;
  QChar in_stack_fffffffffffffe50;
  QChar in_stack_fffffffffffffe52;
  exception_t<cfgfile::qstring_trait_t> local_179;
  undefined1 local_13a;
  char16_t local_fa;
  allocator<char> local_d9 [111];
  char16_t local_6a;
  char16_t local_68;
  char16_t local_66;
  undefined2 local_64;
  char16_t local_62;
  char16_t local_60;
  undefined2 local_5e;
  char16_t local_5c;
  char16_t local_5a;
  undefined2 local_58;
  char16_t local_56;
  char16_t local_54;
  char16_t local_52;
  char16_t local_50;
  char16_t local_4e;
  char16_t local_4c;
  char16_t local_4a;
  int local_48;
  undefined1 local_31;
  char16_t local_14;
  char16_t local_12;
  
  local_12 = const_t<cfgfile::qstring_trait_t>::c_quotes.ucs;
  iVar2 = qstring_wrapper_t::find(in_stack_fffffffffffffe08,in_stack_fffffffffffffe16);
  if (iVar2 == 0) {
    local_14 = const_t<cfgfile::qstring_trait_t>::c_quotes.ucs;
    iVar2 = qstring_wrapper_t::rfind(in_stack_fffffffffffffe08,in_stack_fffffffffffffe16);
    sVar3 = qstring_wrapper_t::length((qstring_wrapper_t *)0x1270ec);
    if (iVar2 == sVar3 + -1) {
      qstring_wrapper_t::length((qstring_wrapper_t *)0x12710f);
      qstring_wrapper_t::substr
                ((qstring_wrapper_t *)
                 CONCAT26(in_stack_fffffffffffffe4e.ucs,
                          CONCAT24(in_stack_fffffffffffffe4c.ucs,
                                   CONCAT22(in_stack_fffffffffffffe4a.ucs,in_stack_fffffffffffffe48)
                                  )),(size_type)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                 (size_type)in_stack_fffffffffffffe40);
      local_31 = 0;
      qstring_wrapper_t::qstring_wrapper_t((qstring_wrapper_t *)0x12713d);
      local_48 = 0;
      do {
        iVar2 = local_48;
        sVar3 = qstring_wrapper_t::length((qstring_wrapper_t *)0x127162);
        if (sVar3 <= iVar2) {
          local_31 = 1;
          qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x127902);
          return in_RDI;
        }
        local_4a = (char16_t)qstring_wrapper_t::at(in_stack_fffffffffffffe08,0);
        local_4c = const_t<cfgfile::qstring_trait_t>::c_back_slash.ucs;
        bVar1 = ::operator==((QChar)local_4a,const_t<cfgfile::qstring_trait_t>::c_back_slash);
        if (bVar1) {
          iVar2 = local_48 + 1;
          sVar3 = qstring_wrapper_t::length((qstring_wrapper_t *)0x1271e6);
          if (sVar3 <= iVar2) {
            what_00 = (string_t *)__cxa_allocate_exception(0x28);
            this = &local_179;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar2,CONCAT22(in_stack_fffffffffffffe52.ucs,
                                               in_stack_fffffffffffffe50.ucs)),
                       (char *)CONCAT26(in_stack_fffffffffffffe4e.ucs,
                                        CONCAT24(in_stack_fffffffffffffe4c.ucs,
                                                 CONCAT22(in_stack_fffffffffffffe4a.ucs,
                                                          in_stack_fffffffffffffe48))),
                       in_stack_fffffffffffffe40);
            qstring_trait_t::from_ascii
                      ((string *)
                       CONCAT26(in_stack_fffffffffffffe4e.ucs,
                                CONCAT24(in_stack_fffffffffffffe4c.ucs,
                                         CONCAT22(in_stack_fffffffffffffe4a.ucs,
                                                  in_stack_fffffffffffffe48))));
            exception_t<cfgfile::qstring_trait_t>::exception_t(this,what_00);
            __cxa_throw(what_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                        exception_t<cfgfile::qstring_trait_t>::~exception_t);
          }
          in_stack_fffffffffffffe52 = qstring_wrapper_t::at(in_stack_fffffffffffffe08,0);
          local_50 = const_t<cfgfile::qstring_trait_t>::c_quotes.ucs;
          local_4e = in_stack_fffffffffffffe52.ucs;
          bVar1 = ::operator==(in_stack_fffffffffffffe52,const_t<cfgfile::qstring_trait_t>::c_quotes
                              );
          if (bVar1) {
            local_52 = const_t<cfgfile::qstring_trait_t>::c_quotes.ucs;
            qstring_wrapper_t::push_back(in_stack_fffffffffffffe08,in_stack_fffffffffffffe16);
          }
          else {
            in_stack_fffffffffffffe50 = qstring_wrapper_t::at(in_stack_fffffffffffffe08,0);
            local_56 = const_t<cfgfile::qstring_trait_t>::c_n.ucs;
            local_54 = in_stack_fffffffffffffe50.ucs;
            bVar1 = ::operator==(in_stack_fffffffffffffe50,const_t<cfgfile::qstring_trait_t>::c_n);
            if (bVar1) {
              local_58 = const_t<cfgfile::qstring_trait_t>::c_carriage_return;
              qstring_wrapper_t::push_back(in_stack_fffffffffffffe08,in_stack_fffffffffffffe16);
            }
            else {
              in_stack_fffffffffffffe4e = qstring_wrapper_t::at(in_stack_fffffffffffffe08,0);
              local_5c = const_t<cfgfile::qstring_trait_t>::c_r.ucs;
              local_5a = in_stack_fffffffffffffe4e.ucs;
              bVar1 = ::operator==(in_stack_fffffffffffffe4e,const_t<cfgfile::qstring_trait_t>::c_r)
              ;
              if (bVar1) {
                local_5e = const_t<cfgfile::qstring_trait_t>::c_line_feed;
                qstring_wrapper_t::push_back(in_stack_fffffffffffffe08,in_stack_fffffffffffffe16);
              }
              else {
                in_stack_fffffffffffffe4c = qstring_wrapper_t::at(in_stack_fffffffffffffe08,0);
                local_62 = const_t<cfgfile::qstring_trait_t>::c_t.ucs;
                local_60 = in_stack_fffffffffffffe4c.ucs;
                bVar1 = ::operator==(in_stack_fffffffffffffe4c,
                                     const_t<cfgfile::qstring_trait_t>::c_t);
                if (bVar1) {
                  local_64 = const_t<cfgfile::qstring_trait_t>::c_tab;
                  qstring_wrapper_t::push_back(in_stack_fffffffffffffe08,in_stack_fffffffffffffe16);
                }
                else {
                  in_stack_fffffffffffffe4a = qstring_wrapper_t::at(in_stack_fffffffffffffe08,0);
                  local_68 = const_t<cfgfile::qstring_trait_t>::c_back_slash.ucs;
                  local_66 = in_stack_fffffffffffffe4a.ucs;
                  bVar1 = ::operator==(in_stack_fffffffffffffe4a,
                                       const_t<cfgfile::qstring_trait_t>::c_back_slash);
                  if (!bVar1) {
                    local_13a = 1;
                    uVar4 = __cxa_allocate_exception(0x28);
                    __a = local_d9;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(iVar2,CONCAT22(in_stack_fffffffffffffe52.ucs,
                                                       in_stack_fffffffffffffe50.ucs)),
                               (char *)CONCAT26(in_stack_fffffffffffffe4e.ucs,
                                                CONCAT24(in_stack_fffffffffffffe4c.ucs,
                                                         CONCAT22(in_stack_fffffffffffffe4a.ucs,
                                                                  in_stack_fffffffffffffe48))),__a);
                    qstring_trait_t::from_ascii
                              ((string *)
                               CONCAT26(in_stack_fffffffffffffe4e.ucs,
                                        CONCAT24(in_stack_fffffffffffffe4c.ucs,
                                                 CONCAT22(in_stack_fffffffffffffe4a.ucs,
                                                          in_stack_fffffffffffffe48))));
                    local_fa = (char16_t)qstring_wrapper_t::at(in_stack_fffffffffffffe08,0);
                    qstring_wrapper_t::qstring_wrapper_t
                              (in_stack_fffffffffffffe08,0,in_stack_fffffffffffffe16);
                    operator+((qstring_wrapper_t *)
                              CONCAT26(in_stack_fffffffffffffe4e.ucs,
                                       CONCAT24(in_stack_fffffffffffffe4c.ucs,
                                                CONCAT22(in_stack_fffffffffffffe4a.ucs,
                                                         in_stack_fffffffffffffe48))),
                              (qstring_wrapper_t *)__a);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(iVar2,CONCAT22(in_stack_fffffffffffffe52.ucs,
                                                       in_stack_fffffffffffffe50.ucs)),
                               (char *)CONCAT26(in_stack_fffffffffffffe4e.ucs,
                                                CONCAT24(in_stack_fffffffffffffe4c.ucs,
                                                         CONCAT22(in_stack_fffffffffffffe4a.ucs,
                                                                  in_stack_fffffffffffffe48))),__a);
                    qstring_trait_t::from_ascii
                              ((string *)
                               CONCAT26(in_stack_fffffffffffffe4e.ucs,
                                        CONCAT24(in_stack_fffffffffffffe4c.ucs,
                                                 CONCAT22(in_stack_fffffffffffffe4a.ucs,
                                                          in_stack_fffffffffffffe48))));
                    operator+((qstring_wrapper_t *)
                              CONCAT26(in_stack_fffffffffffffe4e.ucs,
                                       CONCAT24(in_stack_fffffffffffffe4c.ucs,
                                                CONCAT22(in_stack_fffffffffffffe4a.ucs,
                                                         in_stack_fffffffffffffe48))),
                              (qstring_wrapper_t *)__a);
                    exception_t<cfgfile::qstring_trait_t>::exception_t
                              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
                    local_13a = 0;
                    __cxa_throw(uVar4,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                                exception_t<cfgfile::qstring_trait_t>::~exception_t);
                  }
                  local_6a = const_t<cfgfile::qstring_trait_t>::c_back_slash.ucs;
                  qstring_wrapper_t::push_back(in_stack_fffffffffffffe08,in_stack_fffffffffffffe16);
                }
              }
            }
          }
          local_48 = local_48 + 1;
        }
        else {
          in_stack_fffffffffffffe16 = qstring_wrapper_t::at(in_stack_fffffffffffffe08,0);
          qstring_wrapper_t::push_back(in_stack_fffffffffffffe08,in_stack_fffffffffffffe16);
        }
        local_48 = local_48 + 1;
      } while( true );
    }
  }
  qstring_wrapper_t::qstring_wrapper_t
            ((qstring_wrapper_t *)CONCAT26(in_stack_fffffffffffffe16.ucs,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08);
  return in_RDI;
}

Assistant:

static inline typename Trait::string_t from_cfgfile_format(
	const typename Trait::string_t & what )
{
	if( what.find( const_t< Trait >::c_quotes ) == 0 &&
		what.rfind( const_t< Trait >::c_quotes ) == what.length() - 1 )
	{
		typename Trait::string_t tmp = what.substr( 1, what.length() - 2 );

		typename Trait::string_t result;

		for( typename Trait::string_t::size_type i = 0; i < tmp.length(); ++i )
		{
			if( tmp.at( i ) == const_t< Trait >::c_back_slash )
			{
				if( i + 1 < tmp.length() )
				{
					if( tmp.at( i + 1 ) == const_t< Trait >::c_quotes )
						result.push_back( const_t< Trait >::c_quotes );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_n )
						result.push_back( const_t< Trait >::c_carriage_return );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_r )
						result.push_back( const_t< Trait >::c_line_feed );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_t )
						result.push_back( const_t< Trait >::c_tab );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_back_slash )
						result.push_back( const_t< Trait >::c_back_slash );
					else
						throw exception_t< Trait > ( Trait::from_ascii(
								"Unrecognized backslash sequence \"\\" ) +
							typename Trait::string_t( 1, tmp.at( i + 1 ) ) +
							Trait::from_ascii( "\"." ) );

					++i;
				}
				else
					throw exception_t< Trait > ( Trait::from_ascii(
						"Unfinished backslash sequence \"\\\"." ) );
			}
			else
				result.push_back( tmp.at( i ) );
		}

		return result;
	}
	else
		return what;
}